

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

enable_if_t<_std::is_class<typename_std::decay_t<const_int_&>_>::value,_void>
pbrt::detail::
stringPrintfRecursiveWithPrecision<int_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
          (string *s,char *fmt,string *nextFmt,int precision,int *v,bool *args,bool *args_1,
          bool *args_2,bool *args_3,bool *args_4,bool *args_5,bool *args_6,bool *args_7,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_8,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_9,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_10,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_11,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_12,
          optional<pbrt::Bounds2<float>_> *args_13,optional<pbrt::Bounds2<int>_> *args_14)

{
  int iVar1;
  undefined4 in_register_0000000c;
  string str;
  
  iVar1 = snprintf((char *)0x0,0,(nextFmt->_M_dataplus)._M_p,
                   CONCAT44(in_register_0000000c,precision),(ulong)(uint)*v);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)&str);
  snprintf(str._M_dataplus._M_p,(long)(iVar1 + 1),(nextFmt->_M_dataplus)._M_p,(ulong)(uint)precision
           ,(ulong)(uint)*v);
  std::__cxx11::string::pop_back();
  std::__cxx11::string::append((string *)s);
  stringPrintfRecursive<bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
            (s,fmt,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10,
             args_11,args_12,args_13,args_14);
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

inline typename std::enable_if_t<!std::is_class<typename std::decay_t<T>>::value, void>
stringPrintfRecursiveWithPrecision(std::string *s, const char *fmt,
                                   const std::string &nextFmt, int precision, T &&v,
                                   Args &&... args) {
    size_t size = snprintf(nullptr, 0, nextFmt.c_str(), precision, v) + 1;
    std::string str;
    str.resize(size);
    snprintf(&str[0], size, nextFmt.c_str(), precision, v);
    str.pop_back();  // remove trailing NUL
    *s += str;

    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}